

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMulti.c
# Opt level: O1

void Lpk_CreateCommonOrder
               (char (*pTable) [16],int *piCofVar,int nCBars,int *pPrios,int nVars,int fVerbose)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  int Score [16];
  int pPres [16];
  uint local_b8 [34];
  
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  uVar8 = (ulong)(uint)nVars;
  if (0 < nVars) {
    uVar2 = 0;
    do {
      local_b8[uVar2 + 0x10] = 1;
      uVar2 = uVar2 + 1;
    } while (uVar8 != uVar2);
  }
  if (0 < nCBars) {
    uVar2 = 0;
    do {
      local_b8[(long)piCofVar[uVar2] + 0x10] = 0;
      uVar2 = uVar2 + 1;
    } while ((uint)nCBars != uVar2);
  }
  if (0 < nVars) {
    uVar2 = 0;
    pcVar5 = *pTable;
    do {
      if (local_b8[uVar2 + 0x10] != 0) {
        uVar4 = local_b8[uVar2];
        uVar6 = 0;
        do {
          uVar4 = uVar4 + (int)(*pTable)[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
        local_b8[uVar2] = uVar4;
        lVar7 = 0;
        do {
          uVar4 = uVar4 - (int)pcVar5[lVar7];
          lVar7 = lVar7 + 0x10;
        } while (uVar8 << 4 != lVar7);
        local_b8[uVar2] = uVar4;
      }
      uVar2 = uVar2 + 1;
      pTable = pTable + 1;
      pcVar5 = pcVar5 + 1;
    } while (uVar2 != uVar8);
  }
  if (fVerbose != 0) {
    printf("Scores: ");
    if (0 < nVars) {
      uVar2 = 0;
      do {
        printf("%c=%d ",(ulong)((int)uVar2 + 0x61),(ulong)local_b8[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar8 != uVar2);
    }
    printf("   ");
    printf("Prios: ");
  }
  if (0 < nVars) {
    uVar2 = 0;
    do {
      pPrios[uVar2] = 0x10;
      uVar2 = uVar2 + 1;
    } while (uVar8 != uVar2);
  }
  uVar2 = 1;
  while( true ) {
    if (nVars < 1) {
      uVar4 = 0xfffe7960;
      bVar9 = true;
    }
    else {
      uVar6 = 0xffffffff;
      uVar4 = 0xfffe7960;
      uVar3 = 0;
      do {
        if (local_b8[uVar3 + 0x10] != 0) {
          uVar1 = local_b8[uVar3];
          if ((int)uVar4 < (int)uVar1) {
            uVar6 = uVar3 & 0xffffffff;
          }
          if ((int)uVar4 <= (int)uVar1) {
            uVar4 = uVar1;
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar8 != uVar3);
      bVar9 = (int)uVar6 == -1;
    }
    if (bVar9) break;
    if (fVerbose != 0) {
      printf("%d=",uVar2);
    }
    if (0 < nVars) {
      uVar6 = 0;
      do {
        if ((local_b8[uVar6 + 0x10] != 0) && (local_b8[uVar6] == uVar4)) {
          pPrios[uVar6] = (int)uVar2;
          local_b8[uVar6 + 0x10] = 0;
          if (fVerbose != 0) {
            putchar((int)uVar6 + 0x61);
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    if (fVerbose != 0) {
      putchar(0x20);
    }
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  if (fVerbose != 0) {
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Lpk_CreateCommonOrder( char pTable[][16], int piCofVar[], int nCBars, int pPrios[], int nVars, int fVerbose )
{
    int Score[16] = {0}, pPres[16];
    int i, y, x, iVarBest, ScoreMax, PrioCount;

    // mark the present variables
    for ( i = 0; i < nVars; i++ )
        pPres[i] = 1;
    // remove cofactored variables
    for ( i = 0; i < nCBars; i++ )
        pPres[piCofVar[i]] = 0;

    // compute scores for each leaf
    for ( i = 0; i < nVars; i++ )
    {
        if ( pPres[i] == 0 )
            continue;
        for ( y = 0; y < nVars; y++ )
            Score[i] += pTable[i][y];
        for ( x = 0; x < nVars; x++ )
            Score[i] -= pTable[x][i];
    }

    // print the scores
    if ( fVerbose )
    {
        printf( "Scores: " );
        for ( i = 0; i < nVars; i++ )
            printf( "%c=%d ", 'a'+i, Score[i] );
        printf( "   " );
        printf( "Prios: " );
    }

    // derive variable priority
    // variables with equal score receive the same priority
    for ( i = 0; i < nVars; i++ )
        pPrios[i] = 16;

    // iterate until variables remain
    for ( PrioCount = 1; ; PrioCount++ )
    {
        // find the present variable with the highest score
        iVarBest = -1;
        ScoreMax = -100000;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pPres[i] == 0 )
                continue;
            if ( ScoreMax < Score[i] )
            {
                ScoreMax = Score[i];
                iVarBest = i;
            }
        }
        if ( iVarBest == -1 )
            break;
        // give the next priority to all vars having this score
        if ( fVerbose )
            printf( "%d=", PrioCount );
        for ( i = 0; i < nVars; i++ )
        {
            if ( pPres[i] == 0 )
                continue;
            if ( Score[i] == ScoreMax )
            {
                pPrios[i] = PrioCount;
                pPres[i] = 0;
                if ( fVerbose )
                    printf( "%c", 'a'+i );
            }
        }
        if ( fVerbose )
            printf( " " );
    }
    if ( fVerbose )
        printf( "\n" );
}